

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O2

void __thiscall Diagnostics::validateNetwork(Diagnostics *this,Network *nw)

{
  InputError *this_00;
  NetworkError *pNVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string local_90;
  string local_70;
  string local_50;
  allocator local_29;
  
  iVar6 = Network::count(nw,NODE);
  if (iVar6 < 2) {
    pNVar1 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_90,"",&local_29);
    NetworkError::NetworkError(pNVar1,1,&local_90);
    __cxa_throw(pNVar1,&NetworkError::typeinfo,ENerror::~ENerror);
  }
  bVar2 = hasFixedGradeNodes(nw);
  if (bVar2) {
    bVar2 = hasValidNodes(nw);
    bVar3 = hasValidLinks(nw);
    bVar4 = hasValidValves(nw);
    bVar5 = hasConnectedNodes(nw);
    if ((((bVar5) && (bVar4)) && (bVar2)) && (bVar3)) {
      return;
    }
    this_00 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_50,"",&local_29);
    InputError::InputError(this_00,0,&local_50);
    __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
  }
  pNVar1 = (NetworkError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_70,"",&local_29);
  NetworkError::NetworkError(pNVar1,2,&local_70);
  __cxa_throw(pNVar1,&NetworkError::typeinfo,ENerror::~ENerror);
}

Assistant:

void Diagnostics::validateNetwork(Network* nw)
{
    bool result = true;
    if ( nw->count(Element::NODE) < 2 )
    {
        throw NetworkError(NetworkError::TOO_FEW_NODES, "");
    }
    if ( !hasFixedGradeNodes(nw) )
    {
         throw NetworkError(NetworkError::NO_FIXED_GRADE_NODES, "");
    }
    if ( !hasValidNodes(nw) )      result = false;
    if ( !hasValidLinks(nw) )      result = false;
    if ( !hasValidValves(nw) )     result = false;
    if ( !hasValidCurves(nw) )     result = false;
    if ( !hasConnectedNodes(nw) )  result = false;
    if ( result == false )
    {
        throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
    }
}